

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cppwinrt::reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,reader *this,string_view *name,
          _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *directory_filter)

{
  pointer pbVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  long lVar4;
  pointer __source;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  regex rx;
  string sdk_version;
  smatch match;
  anon_class_16_2_7baea878 add_directory;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *directory_filter_local;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string_type local_50;
  
  add_directory.directory_filter = &directory_filter_local;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &files._M_t._M_impl.super__Rb_tree_header._M_header;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  add_directory.files = &files;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  directory_filter_local = directory_filter;
  pvVar3 = values_abi_cxx11_(this,name);
  __source = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__source == pbVar1) {
      std::_Rb_tree_header::_Rb_tree_header
                (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,
                 &files._M_t._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&files._M_t);
      return __return_storage_ptr__;
    }
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&sdk_version,__source,auto_format);
    bVar2 = std::filesystem::is_directory((path *)&sdk_version);
    std::filesystem::__cxx11::path::~path((path *)&sdk_version);
    if (bVar2) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&rx,__source,auto_format);
      std::filesystem::canonical((path *)&sdk_version);
      const::{lambda(auto:1&&)#1}::operator()
                ((_lambda_auto_1____1_ *)&add_directory,(path *)&sdk_version);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&sdk_version,__source,auto_format);
      bVar2 = std::filesystem::is_regular_file((path *)&sdk_version);
      std::filesystem::__cxx11::path::~path((path *)&sdk_version);
      if (!bVar2) {
        bVar2 = std::operator==(__source,"local");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"Spec \'",(allocator<char> *)&sdk_version);
          throw_invalid<std::__cxx11::string,char[35]>
                    (&local_70,__source,(char (*) [35])"\' not supported outside of Windows");
        }
        sdk_version._M_dataplus._M_p = (pointer)&sdk_version.field_2;
        sdk_version._M_string_length = 0;
        sdk_version.field_2._M_local_buf[0] = '\0';
        bVar2 = std::operator==(__source,"sdk");
        if (!bVar2) {
          bVar2 = std::operator==(__source,"sdk+");
          if (!bVar2) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&rx,"((\\d+)\\.(\\d+)\\.(\\d+)\\.(\\d+))\\+?",0x10);
            match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            match._M_begin._M_current = (char *)0x0;
            match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            bVar2 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              (__source,&match,&rx,0);
            if (bVar2) {
              lVar4 = (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar4 == 0) || (0xfffffffffffffffd < lVar4 / 0x18 - 5U)) {
                this_00 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)match.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
              }
              else {
                this_00 = match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1;
              }
              std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::str(&local_50,this_00);
              std::__cxx11::string::operator=((string *)&sdk_version,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
            std::
            _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&match);
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&rx);
            if (sdk_version._M_string_length == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"Path \'",(allocator<char> *)&rx);
              throw_invalid<std::__cxx11::string,char[29]>
                        (&local_d0,__source,(char (*) [29])"\' is not a file or directory");
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"Spec \'",(allocator<char> *)&rx);
            throw_invalid<std::__cxx11::string,char[35]>
                      (&local_b0,__source,(char (*) [35])"\' not supported outside of Windows");
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Spec \'",(allocator<char> *)&rx);
        throw_invalid<std::__cxx11::string,char[35]>
                  (&local_90,__source,(char (*) [35])"\' not supported outside of Windows");
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&rx,__source,auto_format);
      std::filesystem::canonical((path *)&sdk_version);
      std::filesystem::__cxx11::path::string((string *)&match,(path *)&sdk_version);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&files,(string *)&match);
      std::__cxx11::string::~string((string *)&match);
    }
    std::filesystem::__cxx11::path::~path((path *)&sdk_version);
    std::filesystem::__cxx11::path::~path((path *)&rx);
    __source = __source + 1;
  } while( true );
}

Assistant:

auto files(std::string_view const& name, F directory_filter) const
        {
            std::set<std::string> files;

            auto add_directory = [&](auto&& path)
            {
                for (auto&& file : std::filesystem::directory_iterator(path))
                {
                    if (std::filesystem::is_regular_file(file))
                    {
                        auto filename = file.path().string();

                        if (directory_filter(filename))
                        {
                            files.insert(filename);
                        }
                    }
                }
            };

            for (auto&& path : values(name))
            {
                if (std::filesystem::is_directory(path))
                {
                    add_directory(std::filesystem::canonical(path));
                    continue;
                }

                if (std::filesystem::is_regular_file(path))
                {
                    files.insert(std::filesystem::canonical(path).string());
                    continue;
                }
                if (path == "local")
                {
#if defined(_WIN32) || defined(_WIN64)
                    std::array<char, 260> local{};
#ifdef _WIN64
                    ExpandEnvironmentStringsA("%windir%\\System32\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#else
                    ExpandEnvironmentStringsA("%windir%\\SysNative\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#endif
                    add_directory(local.data());
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                    continue;
                }

                std::string sdk_version;

                if (path == "sdk" || path == "sdk+")
                {
#if defined(_WIN32) || defined(_WIN64)
                    sdk_version = get_sdk_version();
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                }
                else
                {
                    std::regex rx(R"(((\d+)\.(\d+)\.(\d+)\.(\d+))\+?)");
                    std::smatch match;

                    if (std::regex_match(path, match, rx))
                    {
                        sdk_version = match[1].str();
                    }
                }

                if (!sdk_version.empty())
                {
#if defined(_WIN32) || defined(_WIN64)
                    auto sdk_path = get_sdk_path();
                    auto xml_path = sdk_path;
                    xml_path /= L"Platforms\\UAP";
                    xml_path /= sdk_version;
                    xml_path /= L"Platform.xml";

                    add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::required);

                    if (path.back() != '+')
                    {
                        continue;
                    }

                    for (auto&& item : std::filesystem::directory_iterator(sdk_path / L"Extension SDKs"))
                    {
                        xml_path = item.path() / sdk_version;
                        xml_path /= L"SDKManifest.xml";

                        // Not all Extension SDKs include an SDKManifest.xml file; ignore those which do not (e.g. WindowsIoT).
                        add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::optional);
                    }
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */

                    continue;
                }

                throw_invalid("Path '", path, "' is not a file or directory");
            }

            return files;
        }